

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
  }
  else {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      fprintf((FILE *)outfile,"Time,%.16g",*(undefined8 *)((long)cvode_mem + 0x168));
      fprintf((FILE *)outfile,",Steps,%ld",*(undefined8 *)((long)cvode_mem + 0x358));
      fprintf((FILE *)outfile,",Error test fails,%ld",*(undefined8 *)((long)cvode_mem + 0x380));
      fprintf((FILE *)outfile,",NLS step fails,%ld",*(undefined8 *)((long)cvode_mem + 0x368));
      fprintf((FILE *)outfile,",Initial step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x430));
      fprintf((FILE *)outfile,",Last step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x438));
      fprintf((FILE *)outfile,",Current step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x150));
      fprintf((FILE *)outfile,",Last method order,%d",(ulong)*(uint *)((long)cvode_mem + 0x420));
      fprintf((FILE *)outfile,",Current method order,%d",(ulong)*(uint *)((long)cvode_mem + 0x128));
      fprintf((FILE *)outfile,",Stab. lim. order reductions,%ld",
              *(undefined8 *)((long)cvode_mem + 0x568));
      fprintf((FILE *)outfile,",RHS fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x360));
      fprintf((FILE *)outfile,",NLS iters,%ld",*(undefined8 *)((long)cvode_mem + 0x370));
      fprintf((FILE *)outfile,",NLS fails,%ld",*(undefined8 *)((long)cvode_mem + 0x378));
      if (*(long *)((long)cvode_mem + 0x358) < 1) {
        fwrite(",NLS iters per step,0",0x15,1,(FILE *)outfile);
      }
      else {
        fprintf((FILE *)outfile,",NLS iters per step,%.16g",
                (double)*(long *)((long)cvode_mem + 0x370) /
                (double)*(long *)((long)cvode_mem + 0x358));
      }
      fprintf((FILE *)outfile,",LS setups,%ld",*(undefined8 *)((long)cvode_mem + 0x388));
      lVar1 = *(long *)((long)cvode_mem + 0x408);
      if (lVar1 != 0) {
        fprintf((FILE *)outfile,",Jac fn evals,%ld",*(undefined8 *)(lVar1 + 0x88));
        fprintf((FILE *)outfile,",LS RHS fn evals,%ld",*(undefined8 *)(lVar1 + 0x90));
        fprintf((FILE *)outfile,",Prec setup evals,%ld",*(undefined8 *)(lVar1 + 0xa0));
        fprintf((FILE *)outfile,",Prec solves,%ld",*(undefined8 *)(lVar1 + 0xb0));
        fprintf((FILE *)outfile,",LS iters,%ld",*(undefined8 *)(lVar1 + 0xa8));
        fprintf((FILE *)outfile,",LS fails,%ld",*(undefined8 *)(lVar1 + 0xb8));
        fprintf((FILE *)outfile,",Jac-times setups,%ld",*(undefined8 *)(lVar1 + 0xc0));
        fprintf((FILE *)outfile,",Jac-times evals,%ld",*(undefined8 *)(lVar1 + 200));
        if (*(long *)((long)cvode_mem + 0x370) < 1) {
          fwrite(",LS iters per NLS iter,0",0x18,1,(FILE *)outfile);
          fwrite(",Jac evals per NLS iter,0",0x19,1,(FILE *)outfile);
          fwrite(",Prec evals per NLS iter,0",0x1a,1,(FILE *)outfile);
        }
        else {
          fprintf((FILE *)outfile,",LS iters per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0xa8) / (double)*(long *)((long)cvode_mem + 0x370));
          fprintf((FILE *)outfile,",Jac evals per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0x88) / (double)*(long *)((long)cvode_mem + 0x370));
          fprintf((FILE *)outfile,",Prec evals per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0xa0) / (double)*(long *)((long)cvode_mem + 0x370));
        }
      }
      fprintf((FILE *)outfile,",Root fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x5d8));
      lVar1 = *(long *)((long)cvode_mem + 0x5f0);
      if (lVar1 != 0) {
        fprintf((FILE *)outfile,",Projection fn evals,%ld",*(undefined8 *)(lVar1 + 0x40));
        fprintf((FILE *)outfile,",Projection fails,%ld",*(undefined8 *)(lVar1 + 0x48));
      }
      fputc(10,(FILE *)outfile);
      return 0;
    }
    if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      fprintf((FILE *)outfile,"Current time                 = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x168));
      fprintf((FILE *)outfile,"Steps                        = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x358));
      fprintf((FILE *)outfile,"Error test fails             = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x380));
      fprintf((FILE *)outfile,"NLS step fails               = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x368));
      fprintf((FILE *)outfile,"Initial step size            = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x430));
      fprintf((FILE *)outfile,"Last step size               = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x438));
      fprintf((FILE *)outfile,"Current step size            = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x150));
      fprintf((FILE *)outfile,"Last method order            = %d\n",
              (ulong)*(uint *)((long)cvode_mem + 0x420));
      fprintf((FILE *)outfile,"Current method order         = %d\n",
              (ulong)*(uint *)((long)cvode_mem + 0x128));
      fprintf((FILE *)outfile,"Stab. lim. order reductions  = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x568));
      fprintf((FILE *)outfile,"RHS fn evals                 = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x360));
      fprintf((FILE *)outfile,"NLS iters                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x370));
      fprintf((FILE *)outfile,"NLS fails                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x378));
      if (0 < *(long *)((long)cvode_mem + 0x358)) {
        fprintf((FILE *)outfile,"NLS iters per step           = %.16g\n",
                (double)*(long *)((long)cvode_mem + 0x370) /
                (double)*(long *)((long)cvode_mem + 0x358));
      }
      fprintf((FILE *)outfile,"LS setups                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x388));
      lVar1 = *(long *)((long)cvode_mem + 0x408);
      if (lVar1 != 0) {
        fprintf((FILE *)outfile,"Jac fn evals                 = %ld\n",*(undefined8 *)(lVar1 + 0x88)
               );
        fprintf((FILE *)outfile,"LS RHS fn evals              = %ld\n",*(undefined8 *)(lVar1 + 0x90)
               );
        fprintf((FILE *)outfile,"Prec setup evals             = %ld\n",*(undefined8 *)(lVar1 + 0xa0)
               );
        fprintf((FILE *)outfile,"Prec solves                  = %ld\n",*(undefined8 *)(lVar1 + 0xb0)
               );
        fprintf((FILE *)outfile,"LS iters                     = %ld\n",*(undefined8 *)(lVar1 + 0xa8)
               );
        fprintf((FILE *)outfile,"LS fails                     = %ld\n",*(undefined8 *)(lVar1 + 0xb8)
               );
        fprintf((FILE *)outfile,"Jac-times setups             = %ld\n",*(undefined8 *)(lVar1 + 0xc0)
               );
        fprintf((FILE *)outfile,"Jac-times evals              = %ld\n",*(undefined8 *)(lVar1 + 200))
        ;
        if (0 < *(long *)((long)cvode_mem + 0x370)) {
          fprintf((FILE *)outfile,"LS iters per NLS iter        = %.16g\n",
                  (double)*(long *)(lVar1 + 0xa8) / (double)*(long *)((long)cvode_mem + 0x370));
          fprintf((FILE *)outfile,"Jac evals per NLS iter       = %.16g\n",
                  (double)*(long *)(lVar1 + 0x88) / (double)*(long *)((long)cvode_mem + 0x370));
          fprintf((FILE *)outfile,"Prec evals per NLS iter      = %.16g\n",
                  (double)*(long *)(lVar1 + 0xa0) / (double)*(long *)((long)cvode_mem + 0x370));
        }
      }
      fprintf((FILE *)outfile,"Root fn evals                = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x5d8));
      lVar1 = *(long *)((long)cvode_mem + 0x5f0);
      if (lVar1 == 0) {
        return 0;
      }
      fprintf((FILE *)outfile,"Projection fn evals          = %ld\n",*(undefined8 *)(lVar1 + 0x40));
      fprintf((FILE *)outfile,"Projection fails             = %ld\n",*(undefined8 *)(lVar1 + 0x48));
      return 0;
    }
    msgfmt = "Invalid formatting option.";
    iVar2 = -0x16;
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodePrintAllStats",msgfmt);
  return iVar2;
}

Assistant:

int CVodePrintAllStats(void *cvode_mem, FILE *outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodePrintAllStats",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  switch(fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    /* step and method stats */
    fprintf(outfile, "Current time                 = %"RSYM"\n", cv_mem->cv_tn);
    fprintf(outfile, "Steps                        = %ld\n", cv_mem->cv_nst);
    fprintf(outfile, "Error test fails             = %ld\n", cv_mem->cv_netf);
    fprintf(outfile, "NLS step fails               = %ld\n", cv_mem->cv_ncfn);
    fprintf(outfile, "Initial step size            = %"RSYM"\n", cv_mem->cv_h0u);
    fprintf(outfile, "Last step size               = %"RSYM"\n", cv_mem->cv_hu);
    fprintf(outfile, "Current step size            = %"RSYM"\n", cv_mem->cv_next_h);
    fprintf(outfile, "Last method order            = %d\n", cv_mem->cv_qu);
    fprintf(outfile, "Current method order         = %d\n", cv_mem->cv_next_q);
    fprintf(outfile, "Stab. lim. order reductions  = %ld\n", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, "RHS fn evals                 = %ld\n", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, "NLS iters                    = %ld\n", cv_mem->cv_nni);
    fprintf(outfile, "NLS fails                    = %ld\n", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, "NLS iters per step           = %"RSYM"\n",
              (realtype) cv_mem->cv_nni / (realtype) cv_mem->cv_nst);
    }

    /* linear solver stats */
    fprintf(outfile, "LS setups                    = %ld\n", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem) (cv_mem->cv_lmem);
      fprintf(outfile, "Jac fn evals                 = %ld\n", cvls_mem->nje);
      fprintf(outfile, "LS RHS fn evals              = %ld\n", cvls_mem->nfeDQ);
      fprintf(outfile, "Prec setup evals             = %ld\n", cvls_mem->npe);
      fprintf(outfile, "Prec solves                  = %ld\n", cvls_mem->nps);
      fprintf(outfile, "LS iters                     = %ld\n", cvls_mem->nli);
      fprintf(outfile, "LS fails                     = %ld\n", cvls_mem->ncfl);
      fprintf(outfile, "Jac-times setups             = %ld\n", cvls_mem->njtsetup);
      fprintf(outfile, "Jac-times evals              = %ld\n", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, "LS iters per NLS iter        = %"RSYM"\n",
                (realtype) cvls_mem->nli / (realtype) cv_mem->cv_nni);
        fprintf(outfile, "Jac evals per NLS iter       = %"RSYM"\n",
                (realtype) cvls_mem->nje / (realtype) cv_mem->cv_nni);
        fprintf(outfile, "Prec evals per NLS iter      = %"RSYM"\n",
                (realtype) cvls_mem->npe / (realtype) cv_mem->cv_nni);
      }
    }

    /* rootfinding stats */
    fprintf(outfile, "Root fn evals                = %ld\n", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem) (cv_mem->proj_mem);
      fprintf(outfile, "Projection fn evals          = %ld\n", cvproj_mem->nproj);
      fprintf(outfile, "Projection fails             = %ld\n", cvproj_mem->npfails);
    }
    break;

  case SUN_OUTPUTFORMAT_CSV:
    /* step and method stats */
    fprintf(outfile, "Time,%"RSYM, cv_mem->cv_tn);
    fprintf(outfile, ",Steps,%ld", cv_mem->cv_nst);
    fprintf(outfile, ",Error test fails,%ld", cv_mem->cv_netf);
    fprintf(outfile, ",NLS step fails,%ld", cv_mem->cv_ncfn);
    fprintf(outfile, ",Initial step size,%"RSYM, cv_mem->cv_h0u);
    fprintf(outfile, ",Last step size,%"RSYM, cv_mem->cv_hu);
    fprintf(outfile, ",Current step size,%"RSYM, cv_mem->cv_next_h);
    fprintf(outfile, ",Last method order,%d", cv_mem->cv_qu);
    fprintf(outfile, ",Current method order,%d", cv_mem->cv_next_q);
    fprintf(outfile, ",Stab. lim. order reductions,%ld", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, ",RHS fn evals,%ld", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, ",NLS iters,%ld", cv_mem->cv_nni);
    fprintf(outfile, ",NLS fails,%ld", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, ",NLS iters per step,%"RSYM,
              (realtype) cv_mem->cv_nni / (realtype) cv_mem->cv_nst);
    }
    else
    {
      fprintf(outfile, ",NLS iters per step,0");
    }

    /* linear solver stats */
    fprintf(outfile, ",LS setups,%ld", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem) (cv_mem->cv_lmem);
      fprintf(outfile, ",Jac fn evals,%ld", cvls_mem->nje);
      fprintf(outfile, ",LS RHS fn evals,%ld", cvls_mem->nfeDQ);
      fprintf(outfile, ",Prec setup evals,%ld", cvls_mem->npe);
      fprintf(outfile, ",Prec solves,%ld", cvls_mem->nps);
      fprintf(outfile, ",LS iters,%ld", cvls_mem->nli);
      fprintf(outfile, ",LS fails,%ld", cvls_mem->ncfl);
      fprintf(outfile, ",Jac-times setups,%ld", cvls_mem->njtsetup);
      fprintf(outfile, ",Jac-times evals,%ld", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, ",LS iters per NLS iter,%"RSYM,
                (realtype) cvls_mem->nli / (realtype) cv_mem->cv_nni);
        fprintf(outfile, ",Jac evals per NLS iter,%"RSYM,
                (realtype) cvls_mem->nje / (realtype) cv_mem->cv_nni);
        fprintf(outfile, ",Prec evals per NLS iter,%"RSYM,
                (realtype) cvls_mem->npe / (realtype) cv_mem->cv_nni);
      }
      else
      {
        fprintf(outfile, ",LS iters per NLS iter,0");
        fprintf(outfile, ",Jac evals per NLS iter,0");
        fprintf(outfile, ",Prec evals per NLS iter,0");
      }
    }

    /* rootfinding stats */
    fprintf(outfile, ",Root fn evals,%ld", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem) (cv_mem->proj_mem);
      fprintf(outfile, ",Projection fn evals,%ld", cvproj_mem->nproj);
      fprintf(outfile, ",Projection fails,%ld", cvproj_mem->npfails);
    }
    fprintf(outfile, "\n");
    break;

  default:
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodePrintAllStats",
                   "Invalid formatting option.");
    return(CV_ILL_INPUT);
  }

  return(CV_SUCCESS);
}